

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

int64_t intra_model_rd(AV1_COMMON *cm,MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,TX_SIZE tx_size
                      ,int use_hadamard)

{
  BitDepthInfo bd_info_00;
  int iVar1;
  int iVar2;
  int iVar3;
  BitDepthInfo bd_info_01;
  long lVar4;
  BLOCK_SIZE in_CL;
  int in_EDX;
  long in_RSI;
  byte in_R8B;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int64_t satd_cost;
  int max_blocks_high;
  int max_blocks_wide;
  int txbh;
  int txbw;
  int stepc;
  int stepr;
  int col;
  int row;
  BitDepthInfo bd_info;
  MACROBLOCKD *xd;
  MACROBLOCKD *in_stack_ffffffffffffff78;
  tran_low_t *in_stack_ffffffffffffff90;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int local_38;
  int local_34;
  
  get_bit_depth_info(in_stack_ffffffffffffff78);
  iVar9 = tx_size_high_unit[in_R8B];
  iVar8 = tx_size_wide_unit[in_R8B];
  iVar7 = tx_size_wide[in_R8B];
  iVar6 = tx_size_high[in_R8B];
  iVar1 = max_block_wide((MACROBLOCKD *)(in_RSI + 0x1a0),in_CL,in_EDX);
  iVar2 = max_block_high((MACROBLOCKD *)(in_RSI + 0x1a0),in_CL,in_EDX);
  lVar5 = 0;
  bd_info_01 = (BitDepthInfo)(in_RSI + (long)in_EDX * 0x88);
  lVar4 = in_RSI + 0x1b0 + (long)in_EDX * 0xa30;
  for (local_34 = 0; local_34 < iVar2; local_34 = iVar9 + local_34) {
    for (local_38 = 0; local_38 < iVar1; local_38 = iVar8 + local_38) {
      av1_predict_intra_block_facade(_col,_stepc,txbw,txbh,max_blocks_wide,max_blocks_high._3_1_);
      av1_subtract_block(bd_info_01,(int)((ulong)lVar4 >> 0x20),(int)lVar4,
                         (int16_t *)in_stack_ffffffffffffff90,(long)*(int *)(lVar4 + 0x28),
                         (uint8_t *)
                         (*(long *)(lVar4 + 0x10) +
                         (long)((local_34 * *(int *)(lVar4 + 0x28) + local_38) * 4)),
                         CONCAT44(iVar1,iVar2),(uint8_t *)CONCAT44(iVar7,iVar6),
                         CONCAT44(iVar9,iVar8));
      bd_info_00.use_highbitdepth_buf = iVar1;
      bd_info_00.bit_depth = iVar2;
      av1_quick_txfm((int)((ulong)lVar5 >> 0x20),(TX_SIZE)((ulong)lVar5 >> 0x18),bd_info_00,
                     (int16_t *)bd_info_01,(int)((ulong)lVar4 >> 0x20),in_stack_ffffffffffffff90);
      iVar3 = (*aom_satd)(*(tran_low_t **)((long)bd_info_01 + 0x18),tx_size_2d[in_R8B]);
      lVar5 = iVar3 + lVar5;
    }
  }
  return lVar5;
}

Assistant:

static int64_t intra_model_rd(const AV1_COMMON *cm, MACROBLOCK *const x,
                              int plane, BLOCK_SIZE plane_bsize,
                              TX_SIZE tx_size, int use_hadamard) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  int row, col;
  assert(!is_inter_block(xd->mi[0]));
  const int stepr = tx_size_high_unit[tx_size];
  const int stepc = tx_size_wide_unit[tx_size];
  const int txbw = tx_size_wide[tx_size];
  const int txbh = tx_size_high[tx_size];
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  int64_t satd_cost = 0;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  // Prediction.
  for (row = 0; row < max_blocks_high; row += stepr) {
    for (col = 0; col < max_blocks_wide; col += stepc) {
      av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);
      // Here we use p->src_diff and p->coeff as temporary buffers for
      // prediction residue and transform coefficients. The buffers are only
      // used in this for loop, therefore we don't need to properly add offset
      // to the buffers.
      av1_subtract_block(
          bd_info, txbh, txbw, p->src_diff, block_size_wide[plane_bsize],
          p->src.buf + (((row * p->src.stride) + col) << 2), p->src.stride,
          pd->dst.buf + (((row * pd->dst.stride) + col) << 2), pd->dst.stride);
      av1_quick_txfm(use_hadamard, tx_size, bd_info, p->src_diff,
                     block_size_wide[plane_bsize], p->coeff);
      satd_cost += aom_satd(p->coeff, tx_size_2d[tx_size]);
    }
  }
  return satd_cost;
}